

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyexr.h
# Opt level: O3

void tinyexr::miniz::mz_zip_reader_sort_central_dir_offsets_by_filename(mz_zip_archive *pZip)

{
  long lVar1;
  byte bVar2;
  ushort uVar3;
  ushort uVar4;
  uint *puVar5;
  long lVar6;
  long lVar7;
  int iVar8;
  ulong uVar9;
  byte bVar10;
  int iVar11;
  int iVar12;
  ulong uVar13;
  bool bVar14;
  mz_uint32 t;
  uint uVar15;
  int iVar16;
  byte bVar17;
  long *in_RSI;
  ulong uVar18;
  ulong uVar19;
  int iVar20;
  uint uVar21;
  byte *pbVar22;
  byte *pbVar23;
  byte *pbVar24;
  mz_uint32 t_1;
  
  puVar5 = (uint *)in_RSI[8];
  iVar12 = (int)pZip;
  iVar8 = iVar12 + -2 >> 1;
  if (-1 < iVar8) {
    do {
      iVar20 = iVar8 * 2 + 1;
      if (iVar20 < iVar12) {
        lVar6 = *in_RSI;
        lVar7 = in_RSI[4];
        iVar16 = iVar8;
        do {
          iVar11 = iVar16 * 2 + 2;
          uVar21 = 0;
          if (iVar11 < iVar12) {
            uVar13 = (ulong)*(uint *)(lVar7 + (ulong)puVar5[iVar20] * 4);
            uVar18 = (ulong)*(uint *)(lVar7 + (ulong)puVar5[iVar11] * 4);
            lVar1 = lVar6 + uVar13;
            pbVar22 = (byte *)(lVar1 + 0x2e);
            uVar3 = *(ushort *)(lVar1 + 0x1c);
            uVar4 = *(ushort *)(lVar6 + 0x1c + uVar18);
            uVar21 = (uint)uVar4;
            if ((uint)uVar3 < (uint)uVar4) {
              uVar21 = (uint)uVar3;
            }
            pbVar23 = (byte *)((ulong)uVar21 + lVar6 + uVar13 + 0x2e);
            if (uVar21 == 0) {
              bVar10 = 0;
              bVar17 = 0;
            }
            else {
              pbVar24 = (byte *)(uVar18 + lVar6 + 0x2e);
              do {
                bVar17 = *pbVar22;
                bVar10 = bVar17 + 0x20;
                if (0x19 < (byte)(bVar17 + 0xbf)) {
                  bVar10 = bVar17;
                }
                bVar2 = *pbVar24;
                bVar17 = bVar2 + 0x20;
                if (0x19 < (byte)(bVar2 + 0xbf)) {
                  bVar17 = bVar2;
                }
                if (bVar10 != bVar17) break;
                pbVar22 = pbVar22 + 1;
                pbVar24 = pbVar24 + 1;
                bVar17 = bVar10;
              } while (pbVar22 < pbVar23);
            }
            bVar14 = bVar10 < bVar17;
            if (pbVar22 == pbVar23) {
              bVar14 = uVar3 < uVar4;
            }
            uVar21 = (uint)bVar14;
          }
          iVar11 = uVar21 + iVar20;
          uVar21 = puVar5[iVar16];
          uVar18 = (ulong)*(uint *)(lVar7 + (ulong)uVar21 * 4);
          uVar13 = (ulong)*(uint *)(lVar7 + (ulong)puVar5[iVar11] * 4);
          lVar1 = lVar6 + uVar18;
          pbVar22 = (byte *)(lVar1 + 0x2e);
          uVar3 = *(ushort *)(lVar1 + 0x1c);
          uVar4 = *(ushort *)(lVar6 + 0x1c + uVar13);
          uVar15 = (uint)uVar4;
          if ((uint)uVar3 < (uint)uVar4) {
            uVar15 = (uint)uVar3;
          }
          pbVar23 = (byte *)((ulong)uVar15 + lVar6 + uVar18 + 0x2e);
          if (uVar15 == 0) {
            bVar17 = 0;
            bVar10 = 0;
          }
          else {
            pbVar24 = (byte *)(uVar13 + lVar6 + 0x2e);
            do {
              bVar10 = *pbVar22;
              bVar17 = bVar10 + 0x20;
              if (0x19 < (byte)(bVar10 + 0xbf)) {
                bVar17 = bVar10;
              }
              bVar2 = *pbVar24;
              bVar10 = bVar2 + 0x20;
              if (0x19 < (byte)(bVar2 + 0xbf)) {
                bVar10 = bVar2;
              }
              if (bVar17 != bVar10) break;
              pbVar22 = pbVar22 + 1;
              pbVar24 = pbVar24 + 1;
              bVar10 = bVar17;
            } while (pbVar22 < pbVar23);
          }
          bVar14 = bVar10 <= bVar17;
          if (pbVar22 == pbVar23) {
            bVar14 = uVar4 <= uVar3;
          }
          if (bVar14) break;
          puVar5[iVar16] = puVar5[iVar11];
          puVar5[iVar11] = uVar21;
          iVar20 = iVar11 * 2 + 1;
          iVar16 = iVar11;
        } while (iVar20 < iVar12);
      }
      bVar14 = 0 < iVar8;
      iVar8 = iVar8 + -1;
    } while (bVar14);
  }
  if (1 < iVar12) {
    uVar13 = (ulong)pZip & 0xffffffff;
    do {
      uVar21 = puVar5[uVar13 - 1];
      puVar5[uVar13 - 1] = *puVar5;
      *puVar5 = uVar21;
      if (uVar13 < 3) {
        return;
      }
      uVar18 = uVar13 - 1;
      lVar6 = *in_RSI;
      lVar7 = in_RSI[4];
      iVar12 = 0;
      iVar20 = 1;
      iVar8 = 0;
      do {
        uVar15 = 0;
        if ((long)(iVar12 + 2) < (long)uVar18) {
          uVar9 = (ulong)*(uint *)(lVar7 + (ulong)puVar5[iVar20] * 4);
          uVar19 = (ulong)*(uint *)(lVar7 + (ulong)puVar5[iVar12 + 2] * 4);
          lVar1 = lVar6 + uVar9;
          pbVar22 = (byte *)(lVar1 + 0x2e);
          uVar3 = *(ushort *)(lVar1 + 0x1c);
          uVar4 = *(ushort *)(lVar6 + 0x1c + uVar19);
          uVar15 = (uint)uVar4;
          if ((uint)uVar3 < (uint)uVar4) {
            uVar15 = (uint)uVar3;
          }
          pbVar23 = (byte *)((ulong)uVar15 + lVar6 + uVar9 + 0x2e);
          if (uVar15 == 0) {
            bVar17 = 0;
            bVar10 = 0;
          }
          else {
            pbVar24 = (byte *)(uVar19 + lVar6 + 0x2e);
            do {
              bVar10 = *pbVar22;
              bVar17 = bVar10 + 0x20;
              if (0x19 < (byte)(bVar10 + 0xbf)) {
                bVar17 = bVar10;
              }
              bVar2 = *pbVar24;
              bVar10 = bVar2 + 0x20;
              if (0x19 < (byte)(bVar2 + 0xbf)) {
                bVar10 = bVar2;
              }
              if (bVar17 != bVar10) break;
              pbVar22 = pbVar22 + 1;
              pbVar24 = pbVar24 + 1;
              bVar10 = bVar17;
            } while (pbVar22 < pbVar23);
          }
          bVar14 = bVar17 < bVar10;
          if (pbVar22 == pbVar23) {
            bVar14 = uVar3 < uVar4;
          }
          uVar15 = (uint)bVar14;
        }
        iVar16 = uVar15 + iVar20;
        uVar9 = (ulong)*(uint *)(lVar7 + (ulong)uVar21 * 4);
        uVar19 = (ulong)*(uint *)(lVar7 + (ulong)puVar5[iVar16] * 4);
        lVar1 = lVar6 + uVar9;
        pbVar22 = (byte *)(lVar1 + 0x2e);
        uVar3 = *(ushort *)(lVar1 + 0x1c);
        uVar4 = *(ushort *)(lVar6 + 0x1c + uVar19);
        uVar15 = (uint)uVar4;
        if ((uint)uVar3 < (uint)uVar4) {
          uVar15 = (uint)uVar3;
        }
        pbVar23 = (byte *)((ulong)uVar15 + lVar6 + uVar9 + 0x2e);
        if (uVar15 == 0) {
          bVar17 = 0;
          bVar10 = 0;
        }
        else {
          pbVar24 = (byte *)(uVar19 + lVar6 + 0x2e);
          do {
            bVar10 = *pbVar22;
            bVar17 = bVar10 + 0x20;
            if (0x19 < (byte)(bVar10 + 0xbf)) {
              bVar17 = bVar10;
            }
            bVar2 = *pbVar24;
            bVar10 = bVar2 + 0x20;
            if (0x19 < (byte)(bVar2 + 0xbf)) {
              bVar10 = bVar2;
            }
            if (bVar17 != bVar10) break;
            pbVar22 = pbVar22 + 1;
            pbVar24 = pbVar24 + 1;
            bVar10 = bVar17;
          } while (pbVar22 < pbVar23);
        }
        bVar14 = bVar10 <= bVar17;
        if (pbVar22 == pbVar23) {
          bVar14 = uVar4 <= uVar3;
        }
        if (bVar14) break;
        puVar5[iVar8] = puVar5[iVar16];
        puVar5[iVar16] = uVar21;
        iVar12 = iVar16 * 2;
        iVar20 = iVar16 * 2 + 1;
        iVar8 = iVar16;
      } while ((long)iVar20 < (long)uVar18);
      bVar14 = 2 < uVar13;
      uVar13 = uVar18;
    } while (bVar14);
  }
  return;
}

Assistant:

static void mz_zip_reader_sort_central_dir_offsets_by_filename(
    mz_zip_archive *pZip) {
  mz_zip_internal_state *pState = pZip->m_pState;
  const mz_zip_array *pCentral_dir_offsets = &pState->m_central_dir_offsets;
  const mz_zip_array *pCentral_dir = &pState->m_central_dir;
  mz_uint32 *pIndices = &MZ_ZIP_ARRAY_ELEMENT(
      &pState->m_sorted_central_dir_offsets, mz_uint32, 0);
  const int size = pZip->m_total_files;
  int start = (size - 2) >> 1, end;
  while (start >= 0) {
    int child, root = start;
    for (;;) {
      if ((child = (root << 1) + 1) >= size) break;
      child +=
          (((child + 1) < size) &&
           (mz_zip_reader_filename_less(pCentral_dir, pCentral_dir_offsets,
                                        pIndices[child], pIndices[child + 1])));
      if (!mz_zip_reader_filename_less(pCentral_dir, pCentral_dir_offsets,
                                       pIndices[root], pIndices[child]))
        break;
      MZ_SWAP_UINT32(pIndices[root], pIndices[child]);
      root = child;
    }
    start--;
  }

  end = size - 1;
  while (end > 0) {
    int child, root = 0;
    MZ_SWAP_UINT32(pIndices[end], pIndices[0]);
    for (;;) {
      if ((child = (root << 1) + 1) >= end) break;
      child +=
          (((child + 1) < end) &&
           mz_zip_reader_filename_less(pCentral_dir, pCentral_dir_offsets,
                                       pIndices[child], pIndices[child + 1]));
      if (!mz_zip_reader_filename_less(pCentral_dir, pCentral_dir_offsets,
                                       pIndices[root], pIndices[child]))
        break;
      MZ_SWAP_UINT32(pIndices[root], pIndices[child]);
      root = child;
    }
    end--;
  }
}